

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O3

void uo_cb_append_cb(uo_cb *cb,uo_cb *cb_after)

{
  ulong uVar1;
  void **__src;
  size_t sVar2;
  uo_linklist *puVar3;
  uo_linklist *puVar4;
  uo_linklist *puVar5;
  uo_linklist *puVar6;
  void **__ptr;
  ulong uVar7;
  size_t sVar8;
  uo_linklist *puVar9;
  long in_FS_OFFSET;
  
  __src = (cb_after->stack).items;
  sVar2 = (cb_after->stack).count;
  __ptr = (cb->stack).items;
  sVar8 = (cb->stack).count;
  uVar1 = sVar8 + sVar2;
  if ((cb->stack).capacity < uVar1) {
    uVar7 = uVar1 - 1 >> 1 | uVar1 - 1;
    uVar7 = uVar7 >> 2 | uVar7;
    uVar7 = uVar7 >> 4 | uVar7;
    uVar7 = uVar7 >> 8 | uVar7;
    uVar7 = uVar7 >> 0x10 | uVar7;
    uVar7 = uVar7 >> 0x20 | uVar7;
    (cb->stack).capacity = uVar7 + 1;
    __ptr = (void **)realloc(__ptr,uVar7 * 8 + 8);
    (cb->stack).items = __ptr;
    sVar8 = (cb->stack).count;
  }
  memmove(__ptr + sVar2,__ptr,sVar8 << 3);
  memcpy((cb->stack).items,__src,sVar2 << 3);
  (cb->stack).count = uVar1;
  puVar9 = (cb_after->funclist).next;
  if (puVar9 != &cb_after->funclist) {
    do {
      puVar3 = puVar9[1].next;
      uo_cb_func_linkpool_grow(0x20);
      puVar4 = *(uo_linklist **)(in_FS_OFFSET + -0x20);
      puVar5 = puVar4->next;
      puVar6 = puVar4->prev;
      puVar5->prev = puVar6;
      puVar6->next = puVar5;
      puVar4->next = (uo_linklist *)0x0;
      puVar4->prev = (uo_linklist *)0x0;
      puVar4[1].next = puVar3;
      puVar3 = (cb->funclist).prev;
      puVar4->prev = puVar3;
      puVar3->next = puVar4;
      puVar4->next = &cb->funclist;
      (cb->funclist).prev = puVar4;
      puVar9 = puVar9->next;
    } while (puVar9 != &cb_after->funclist);
  }
  return;
}

Assistant:

void uo_cb_append_cb(
    uo_cb *cb,
    uo_cb *cb_after)
{
    uo_stack_insert_arr(&cb->stack, 0, cb_after->stack.items, cb_after->stack.count);

    uo_linklist *link = cb_after->funclist.next;

    while (link != &cb_after->funclist)
    {
        uo_cb_append_func(cb, ((uo_cb_func_linklist *)link)->item);
        link = link->next;
    }
}